

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall Search::search::set_options(search *this,uint32_t opts)

{
  search_private *psVar1;
  vw_exception *this_00;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  psVar1 = this->priv;
  if ((psVar1->all->vw_is_main == true) && (psVar1->state != INITIALIZE)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: task should not set options except in initialize function!",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    psVar1 = this->priv;
  }
  if ((AUTO_CONDITION_FEATURES & opts) != 0) {
    psVar1->auto_condition_features = true;
    psVar1 = this->priv;
  }
  if ((AUTO_HAMMING_LOSS & opts) != 0) {
    psVar1->auto_hamming_loss = true;
    psVar1 = this->priv;
  }
  if ((EXAMPLES_DONT_CHANGE & opts) != 0) {
    psVar1->examples_dont_change = true;
    psVar1 = this->priv;
  }
  if ((IS_LDF & opts) != 0) {
    psVar1->is_ldf = true;
    psVar1 = this->priv;
  }
  if ((NO_CACHING & opts) != 0) {
    psVar1->no_caching = true;
    psVar1 = this->priv;
  }
  if ((ACTION_COSTS & opts) != 0) {
    psVar1->use_action_costs = true;
    psVar1 = this->priv;
  }
  if ((psVar1->is_ldf == true) && ((psVar1->use_action_costs & 1U) != 0)) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_190,
               "using LDF and actions costs is not yet implemented; turn off action costs",0x49);
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
               ,0xbee,&local_1c0);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (((psVar1->use_action_costs & 1U) != 0) && (psVar1->rollout_method != NO_ROLLOUT)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: task is designed to use rollout costs, but this only works when --search_rollout none is specified"
               ,0x6b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void search::set_options(uint32_t opts)
{
  if (this->priv->all->vw_is_main && (this->priv->state != INITIALIZE))
    std::cerr << "warning: task should not set options except in initialize function!" << endl;
  if ((opts & AUTO_CONDITION_FEATURES) != 0)
    this->priv->auto_condition_features = true;
  if ((opts & AUTO_HAMMING_LOSS) != 0)
    this->priv->auto_hamming_loss = true;
  if ((opts & EXAMPLES_DONT_CHANGE) != 0)
    this->priv->examples_dont_change = true;
  if ((opts & IS_LDF) != 0)
    this->priv->is_ldf = true;
  if ((opts & NO_CACHING) != 0)
    this->priv->no_caching = true;
  if ((opts & ACTION_COSTS) != 0)
    this->priv->use_action_costs = true;

  if (this->priv->is_ldf && this->priv->use_action_costs)
    THROW("using LDF and actions costs is not yet implemented; turn off action costs");  // TODO fix

  if (this->priv->use_action_costs && (this->priv->rollout_method != NO_ROLLOUT))
    std::cerr
        << "warning: task is designed to use rollout costs, but this only works when --search_rollout none is specified"
        << endl;
}